

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::analyze_meshlet_writes
          (CompilerHLSL *this,uint32_t func_id,uint32_t id_per_vertex,uint32_t id_per_primitive,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  size_t *psVar1;
  StorageClass SVar2;
  size_t sVar3;
  Variant *pVVar4;
  ID IVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  iterator iVar9;
  SPIRFunction *pSVar10;
  SPIRBlock *pSVar11;
  uint32_t *puVar12;
  ulong uVar13;
  SPIRVariable *var;
  SPIRFunction *pSVar14;
  uint uVar15;
  long lVar16;
  Instruction *instr;
  Parameter *pPVar17;
  uint32_t uVar18;
  Parameter *iarg;
  Parameter *pPVar19;
  __hashtable *__h;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range5;
  TypedID<(spirv_cross::Types)6> *block;
  __node_gen_type __node_gen;
  uint32_t local_6c;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_68;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *local_60;
  TypedID<(spirv_cross::Types)6> *local_58;
  TypedID<(spirv_cross::Types)6> *local_50;
  Parameter *local_48;
  Instruction *local_40;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  local_6c = func_id;
  local_68 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)processed_func_ids;
  iVar9 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&processed_func_ids->_M_h,&local_6c);
  if (iVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_38 = local_68;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (local_68,&local_6c);
    pSVar10 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + local_6c);
    sVar3 = (pSVar10->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
            buffer_size;
    if (sVar3 != 0) {
      local_50 = (pSVar10->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
                 ptr;
      local_58 = local_50 + sVar3;
      local_60 = &pSVar10->arguments;
      do {
        pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + local_50->id);
        sVar3 = (pSVar11->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
        if (sVar3 != 0) {
          instr = (pSVar11->ops).super_VectorView<spirv_cross::Instruction>.ptr;
          local_40 = instr + sVar3;
          do {
            puVar12 = Compiler::stream((Compiler *)this,instr);
            uVar15 = instr->op - 0x39;
            if (uVar15 < 0xe) {
              if ((0x2f30U >> (uVar15 & 0x1f) & 1) == 0) {
                if (uVar15 == 0) {
                  uVar15 = puVar12[2];
                  analyze_meshlet_writes
                            (this,uVar15,id_per_vertex,id_per_primitive,
                             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_68);
                  pSVar14 = Variant::get<spirv_cross::SPIRFunction>
                                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr + uVar15);
                  sVar3 = (pSVar14->arguments).
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                  if (sVar3 != 0) {
                    pPVar19 = (pSVar14->arguments).
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                    pPVar17 = pPVar19 + sVar3;
                    local_48 = pPVar17;
                    do {
                      if (pPVar19->alias_global_variable == true) {
                        sVar3 = (pSVar10->arguments).
                                super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                        uVar18 = (pPVar19->id).id;
                        if (sVar3 != 0) {
                          lVar16 = 0;
                          do {
                            if (*(uint32_t *)
                                 ((long)&(((pSVar10->arguments).
                                           super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                          ptr)->id).id + lVar16) == uVar18) goto LAB_00230647;
                            lVar16 = lVar16 + 0x14;
                          } while (sVar3 * 0x14 != lVar16);
                        }
                        uVar8 = Compiler::expression_type_id((Compiler *)this,uVar18);
                        uVar18 = pPVar19->write_count;
                        IVar5.id = (pPVar19->id).id;
                        uVar7 = pPVar19->read_count;
                        SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                                  (local_60,(pSVar10->arguments).
                                            super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                            buffer_size + 1);
                        pPVar17 = (pSVar10->arguments).
                                  super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                        sVar3 = (pSVar10->arguments).
                                super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                        pPVar17[sVar3].type.id = uVar8;
                        pPVar17[sVar3].id = (ID)IVar5.id;
                        pPVar17[sVar3].read_count = uVar7;
                        pPVar17[sVar3].write_count = uVar18;
                        pPVar17[sVar3].alias_global_variable = true;
                        psVar1 = &(pSVar10->arguments).
                                  super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
                        ;
                        *psVar1 = *psVar1 + 1;
                        pPVar17 = local_48;
                      }
LAB_00230647:
                      pPVar19 = pPVar19 + 1;
                    } while (pPVar19 != pPVar17);
                  }
                }
              }
              else {
                uVar13 = (ulong)puVar12[(ulong)(instr->op != 0x3e) * 2];
                if ((uVar13 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.buffer_size) &&
                   (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr,
                   pVVar4[uVar13].type == TypeVariable)) {
                  var = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar13);
                  if ((var->storage == StorageClassTaskPayloadWorkgroupEXT) ||
                     (var->storage == Output)) {
                    uVar7 = Compiler::get_decoration
                                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
                    uVar18 = (var->super_IVariant).self.id;
                    if ((uVar7 - 0x14b1 < 0xfffffffd) &&
                       (var->storage != StorageClassTaskPayloadWorkgroupEXT)) {
                      bVar6 = CompilerGLSL::is_per_primitive_variable(&this->super_CompilerGLSL,var)
                      ;
                      uVar18 = id_per_vertex;
                      if (bVar6) {
                        uVar18 = id_per_primitive;
                      }
                    }
                    sVar3 = (pSVar10->arguments).
                            super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                    if (sVar3 != 0) {
                      lVar16 = 0;
                      do {
                        if (*(uint32_t *)
                             ((long)&(((pSVar10->arguments).
                                       super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr)->
                                     id).id + lVar16) == uVar18) goto LAB_00230654;
                        lVar16 = lVar16 + 0x14;
                      } while (sVar3 * 0x14 != lVar16);
                    }
                    uVar7 = Compiler::expression_type_id((Compiler *)this,uVar18);
                    SVar2 = var->storage;
                    SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                              (local_60,(pSVar10->arguments).
                                        super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                        buffer_size + 1);
                    pPVar17 = (pSVar10->arguments).
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                    sVar3 = (pSVar10->arguments).
                            super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                    pPVar17[sVar3].type.id = uVar7;
                    pPVar17[sVar3].id.id = uVar18;
                    pPVar17[sVar3].read_count = 1;
                    pPVar17[sVar3].write_count =
                         (uint)(SVar2 != StorageClassTaskPayloadWorkgroupEXT);
                    pPVar17[sVar3].alias_global_variable = true;
                    psVar1 = &(pSVar10->arguments).
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                    *psVar1 = *psVar1 + 1;
                  }
                }
              }
            }
LAB_00230654:
            instr = instr + 1;
          } while (instr != local_40);
        }
        local_50 = local_50 + 1;
      } while (local_50 != local_58);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::analyze_meshlet_writes(uint32_t func_id, uint32_t id_per_vertex, uint32_t id_per_primitive,
                                          std::unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
		return;
	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);
	// Recursively establish global args added to functions on which we depend.
	for (auto& block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpFunctionCall:
			{
				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				analyze_meshlet_writes(inner_func_id, id_per_vertex, id_per_primitive, processed_func_ids);
				auto &inner_func = get<SPIRFunction>(inner_func_id);
				for (auto &iarg : inner_func.arguments)
				{
					if (!iarg.alias_global_variable)
						continue;

					bool already_declared = false;
					for (auto &arg : func.arguments)
					{
						if (arg.id == iarg.id)
						{
							already_declared = true;
							break;
						}
					}

					if (!already_declared)
					{
						// basetype is effectively ignored here since we declare the argument
						// with explicit types. Just pass down a valid type.
						func.arguments.push_back({ expression_type_id(iarg.id), iarg.id,
						                           iarg.read_count, iarg.write_count, true });
					}
				}
				break;
			}

			case OpStore:
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpInBoundsPtrAccessChain:
			case OpArrayLength:
			{
				auto *var = maybe_get<SPIRVariable>(ops[op == OpStore ? 0 : 2]);
				if (var && (var->storage == StorageClassOutput || var->storage == StorageClassTaskPayloadWorkgroupEXT))
				{
					bool already_declared = false;
					auto builtin_type = BuiltIn(get_decoration(var->self, DecorationBuiltIn));

					uint32_t var_id = var->self;
					if (var->storage != StorageClassTaskPayloadWorkgroupEXT &&
						builtin_type != BuiltInPrimitivePointIndicesEXT &&
						builtin_type != BuiltInPrimitiveLineIndicesEXT &&
						builtin_type != BuiltInPrimitiveTriangleIndicesEXT)
					{
						var_id = is_per_primitive_variable(*var) ? id_per_primitive : id_per_vertex;
					}

					for (auto &arg : func.arguments)
					{
						if (arg.id == var_id)
						{
							already_declared = true;
							break;
						}
					}

					if (!already_declared)
					{
						// basetype is effectively ignored here since we declare the argument
						// with explicit types. Just pass down a valid type.
						uint32_t type_id = expression_type_id(var_id);
						if (var->storage == StorageClassTaskPayloadWorkgroupEXT)
							func.arguments.push_back({ type_id, var_id, 1u, 0u, true });
						else
							func.arguments.push_back({ type_id, var_id, 1u, 1u, true });
					}
				}
				break;
			}

			default:
				break;
			}
		}
	}
}